

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ImGuiWindow *hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiContext *pIVar3;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  if ((GImGui->DragDropActive & 1U) == 0) {
    local_1 = false;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    if ((GImGui->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) ||
       (pIVar1->RootWindow != GImGui->HoveredWindowUnderMovingWindow->RootWindow)) {
      local_1 = false;
    }
    else {
      pIVar3 = GImGui;
      bVar2 = IsMouseHoveringRect((ImVec2 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  (ImVec2 *)GImGui,SUB81((ulong)pIVar1 >> 0x38,0));
      if ((bVar2) && (in_ESI != (pIVar3->DragDropPayload).SourceId)) {
        if ((pIVar1->SkipItems & 1U) == 0) {
          (pIVar3->DragDropTargetRect).Min = *in_RDI;
          (pIVar3->DragDropTargetRect).Max = in_RDI[1];
          (pIVar3->DragDropTargetClipRect).Min = (pIVar1->ClipRect).Min;
          (pIVar3->DragDropTargetClipRect).Max = (pIVar1->ClipRect).Max;
          pIVar3->DragDropTargetId = in_ESI;
          pIVar3->DragDropWithinTarget = true;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false && g.DragDropWithinSource == false); // Can't nest BeginDragDropSource() and BeginDragDropTarget()
    g.DragDropTargetRect = bb;
    g.DragDropTargetClipRect = window->ClipRect; // May want to be overridden by user depending on use case?
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}